

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O1

bool __thiscall MeCab::Writer::writeEM(Writer *this,Lattice *lattice,StringBuffer *os)

{
  int iVar1;
  undefined4 extraout_var;
  StringBuffer *pSVar3;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *extraout_RDX_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *extraout_RDX_03;
  void *pvVar4;
  long lVar5;
  long lVar2;
  
  iVar1 = (*lattice->_vptr_Lattice[2])(lattice);
  lVar2 = CONCAT44(extraout_var,iVar1);
  pvVar4 = extraout_RDX;
  do {
    if (lVar2 == 0) {
      StringBuffer::write(os,0x130dc7,pvVar4,in_RCX);
      return true;
    }
    if (0.0001 <= *(float *)(lVar2 + 0x5c)) {
      StringBuffer::write(os,0x13329c,pvVar4,in_RCX);
      if (*(char *)(lVar2 + 0x4f) == '\x03') {
        iVar1 = 0x1323b8;
LAB_0012cdbb:
        StringBuffer::write(os,iVar1,__buf,in_RCX);
        pvVar4 = extraout_RDX_00;
      }
      else {
        if (*(char *)(lVar2 + 0x4f) == '\x02') {
          iVar1 = 0x13329f;
          goto LAB_0012cdbb;
        }
        StringBuffer::write(os,(int)*(undefined8 *)(lVar2 + 0x30),
                            (void *)(ulong)*(ushort *)(lVar2 + 0x44),in_RCX);
        pvVar4 = extraout_RDX_01;
      }
      pSVar3 = (StringBuffer *)StringBuffer::write(os,9,pvVar4,in_RCX);
      pSVar3 = (StringBuffer *)
               StringBuffer::write(pSVar3,(int)*(undefined8 *)(lVar2 + 0x38),__buf_00,in_RCX);
      pSVar3 = (StringBuffer *)StringBuffer::write(pSVar3,9,__buf_01,in_RCX);
      pSVar3 = StringBuffer::operator<<(pSVar3,(double)*(float *)(lVar2 + 0x5c));
      StringBuffer::write(pSVar3,10,__buf_02,in_RCX);
      pvVar4 = extraout_RDX_02;
    }
    for (lVar5 = *(long *)(lVar2 + 0x28); lVar5 != 0; lVar5 = *(long *)(lVar5 + 0x18)) {
      if (0.0001 <= *(float *)(lVar5 + 0x24)) {
        pSVar3 = (StringBuffer *)StringBuffer::write(os,0x1332a3,pvVar4,in_RCX);
        in_RCX = *(size_t *)(lVar5 + 0x10);
        pSVar3 = (StringBuffer *)
                 StringBuffer::write(pSVar3,(int)*(undefined8 *)(in_RCX + 0x38),__buf_03,in_RCX);
        pSVar3 = (StringBuffer *)StringBuffer::write(pSVar3,9,__buf_04,in_RCX);
        pSVar3 = (StringBuffer *)
                 StringBuffer::write(pSVar3,(int)*(undefined8 *)(lVar2 + 0x38),__buf_05,in_RCX);
        pSVar3 = (StringBuffer *)StringBuffer::write(pSVar3,9,__buf_06,in_RCX);
        pSVar3 = StringBuffer::operator<<(pSVar3,(double)*(float *)(lVar5 + 0x24));
        StringBuffer::write(pSVar3,10,__buf_07,in_RCX);
        pvVar4 = extraout_RDX_03;
      }
    }
    lVar2 = *(long *)(lVar2 + 8);
  } while( true );
}

Assistant:

bool Writer::writeEM(Lattice *lattice, StringBuffer *os) const {
  static const float min_prob = 0.0001;
  for (const Node *node = lattice->bos_node(); node; node = node->next) {
    if (node->prob >= min_prob) {
      *os << "U\t";
      if (node->stat == MECAB_BOS_NODE) {
        *os << "BOS";
      } else if (node->stat == MECAB_EOS_NODE) {
        *os << "EOS";
      }  else {
        os->write(node->surface, node->length);
      }
      *os << '\t' << node->feature << '\t' << node->prob << '\n';
    }
    for (const Path *path = node->lpath; path; path = path->lnext) {
      if (path->prob >= min_prob) {
        *os << "B\t" << path->lnode->feature << '\t'
            << node->feature << '\t' << path->prob << '\n';
      }
    }
  }
  *os << "EOS\n";
  return true;
}